

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

LocalizedNumberFormatter * __thiscall
icu_63::number::LocalizedNumberFormatter::operator=(LocalizedNumberFormatter *this,LNF *src)

{
  PluralRules *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  UNumberSignDisplay UVar5;
  long lVar6;
  Precision *pPVar7;
  Precision *pPVar8;
  byte bVar9;
  
  bVar9 = 0;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.scientific.fExponentSignDisplay =
       (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       notation.fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation
       = *(undefined8 *)
          &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           notation;
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.unit,
             &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros
              .unit);
  MeasureUnit::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.perUnit,
             &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros
              .perUnit);
  pPVar7 = &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
            precision;
  pPVar8 = &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
            precision;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar4 = *(undefined4 *)&pPVar7->field_0x4;
    pPVar8->fType = pPVar7->fType;
    *(undefined4 *)&pPVar8->field_0x4 = uVar4;
    pPVar7 = (Precision *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
  integerWidth.fHasError =
       (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       integerWidth.fHasError;
  *(undefined4 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           integerWidth.fUnion + 4) =
       *(undefined4 *)
        ((long)&(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                fMacros.integerWidth.fUnion + 4);
  impl::SymbolsWrapper::operator=
            (&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
              fMacros.symbols,
             &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros
              .symbols);
  UVar5 = (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
          sign;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.unitWidth
       = (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
         unitWidth;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.sign =
       UVar5;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.decimal =
       (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       decimal;
  Scale::operator=(&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                    fMacros.scale,
                   &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                    fMacros.scale);
  pPVar1 = (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           rules;
  uVar2 = *(undefined8 *)
           ((long)&(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                   fMacros.rules + 4);
  uVar3 = *(undefined8 *)
           ((long)&(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                   fMacros.currencySymbols + 4);
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
  affixProvider =
       (src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
       affixProvider;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.rules =
       pPVar1;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           rules + 4) = uVar2;
  *(undefined8 *)
   ((long)&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
           currencySymbols + 4) = uVar3;
  Locale::operator=(&(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>)
                     .fMacros.locale,
                    &(src->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).
                     fMacros.locale);
  if (src->fCompiled == (NumberFormatterImpl *)0x0) {
    clear(this);
  }
  else {
    lnfMoveHelper(this,src);
  }
  return this;
}

Assistant:

LocalizedNumberFormatter& LocalizedNumberFormatter::operator=(LNF&& src) U_NOEXCEPT {
    NFS<LNF>::operator=(static_cast<NFS<LNF>&&>(src));
    // For the move operators, copy over the compiled formatter.
    // Note: if the formatter is not compiled, call count information is lost.
    if (static_cast<LNF&&>(src).fCompiled != nullptr) {
        // Formatter is compiled
        lnfMoveHelper(static_cast<LNF&&>(src));
    } else {
        clear();
    }
    return *this;
}